

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

void __thiscall SslTcpSocket::SslTcpSocket(SslTcpSocket *this)

{
  unique_ptr<SslTcpSocketImpl,_std::default_delete<SslTcpSocketImpl>_> local_18;
  SslTcpSocket *local_10;
  SslTcpSocket *this_local;
  
  local_10 = this;
  TcpSocket::TcpSocket(&this->super_TcpSocket,false);
  (this->super_TcpSocket).super_BaseSocket._vptr_BaseSocket =
       (_func_int **)&PTR__SslTcpSocket_001b8a98;
  std::make_unique<SslTcpSocketImpl,SslTcpSocket*>((SslTcpSocket **)&local_18);
  std::unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>>::operator=
            ((unique_ptr<BaseSocketImpl,std::default_delete<BaseSocketImpl>> *)
             &(this->super_TcpSocket).super_BaseSocket.Impl_,&local_18);
  std::unique_ptr<SslTcpSocketImpl,_std::default_delete<SslTcpSocketImpl>_>::~unique_ptr(&local_18);
  return;
}

Assistant:

SslTcpSocket::SslTcpSocket() : TcpSocket(false)
{
    Impl_ = make_unique<SslTcpSocketImpl>(this);
}